

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O0

list<PassDetails,_std::allocator<PassDetails>_> *
GeneratePassList_abi_cxx11_
          (list<PassDetails,_std::allocator<PassDetails>_> *__return_storage_ptr__,
          CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *start_time,DateTime *end_time,int time_step)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_1a0 [8];
  PassDetails pd_1;
  TimeSpan local_178;
  int64_t local_170;
  undefined1 local_168 [8];
  PassDetails pd;
  undefined1 local_140 [8];
  CoordTopocentric topo;
  Eci eci;
  DateTime DStack_d0;
  bool end_of_pass;
  DateTime current_time;
  DateTime previous_time;
  DateTime DStack_b8;
  bool found_aos;
  DateTime los_time;
  DateTime aos_time;
  undefined1 local_98 [8];
  Observer obs;
  int time_step_local;
  DateTime *end_time_local;
  DateTime *start_time_local;
  SGP4 *sgp4_local;
  CoordGeodetic *user_geo_local;
  list<PassDetails,_std::allocator<PassDetails>_> *pass_list;
  
  obs.m_eci.m_velocity.w._3_1_ = 0;
  obs.m_eci.m_velocity.w._4_4_ = time_step;
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::list(__return_storage_ptr__);
  libsgp4::Observer::Observer((Observer *)local_98,user_geo);
  libsgp4::DateTime::DateTime(&los_time);
  libsgp4::DateTime::DateTime(&stack0xffffffffffffff48);
  bVar2 = false;
  current_time = (DateTime)start_time->m_encoded;
  DStack_d0 = (DateTime)start_time->m_encoded;
  while (bVar1 = libsgp4::operator<(&stack0xffffffffffffff30,end_time), bVar1) {
    bVar1 = false;
    libsgp4::SGP4::FindPosition((Eci *)&topo.range_rate,sgp4,&stack0xffffffffffffff30);
    libsgp4::Observer::GetLookAngle
              ((CoordTopocentric *)local_140,(Observer *)local_98,(Eci *)&topo.range_rate);
    if ((bVar2) || (topo.azimuth <= 0.0)) {
      if ((bVar2) && (topo.azimuth < 0.0)) {
        bVar2 = false;
        bVar1 = true;
        pd.max_elevation =
             (double)FindCrossingPoint(user_geo,sgp4,&current_time,&stack0xffffffffffffff30,false);
        DStack_b8 = (DateTime)pd.max_elevation;
        PassDetails::PassDetails((PassDetails *)local_168);
        local_168 = (undefined1  [8])los_time.m_encoded;
        pd.aos.m_encoded = DStack_b8.m_encoded;
        pd.los.m_encoded =
             (int64_t)FindMaxElevation(user_geo,sgp4,&los_time,&stack0xffffffffffffff48);
        std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::push_back
                  (__return_storage_ptr__,(value_type *)local_168);
      }
    }
    else {
      bVar2 = libsgp4::operator==(start_time,&stack0xffffffffffffff30);
      if (bVar2) {
        los_time = (DateTime)start_time->m_encoded;
      }
      else {
        los_time = FindCrossingPoint(user_geo,sgp4,&current_time,&stack0xffffffffffffff30,true);
      }
      bVar2 = true;
    }
    current_time.m_encoded = DStack_d0.m_encoded;
    if (bVar1) {
      libsgp4::TimeSpan::TimeSpan(&local_178,0,0x1e,0);
      local_170 = (int64_t)libsgp4::operator+(&stack0xffffffffffffff30,local_178);
      DStack_d0 = (DateTime)local_170;
    }
    else {
      libsgp4::TimeSpan::TimeSpan((TimeSpan *)&pd_1.max_elevation,0,0,obs.m_eci.m_velocity.w._4_4_);
      DStack_d0 = libsgp4::operator+(&stack0xffffffffffffff30,(TimeSpan)pd_1.max_elevation);
    }
    bVar1 = libsgp4::operator>(&stack0xffffffffffffff30,end_time);
    if (bVar1) {
      DStack_d0 = (DateTime)end_time->m_encoded;
    }
  }
  if (bVar2) {
    PassDetails::PassDetails((PassDetails *)local_1a0);
    local_1a0 = (undefined1  [8])los_time.m_encoded;
    pd_1.aos = (DateTime)end_time->m_encoded;
    pd_1.los.m_encoded = (int64_t)FindMaxElevation(user_geo,sgp4,&los_time,end_time);
    std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<struct PassDetails> GeneratePassList(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& start_time,
        const libsgp4::DateTime& end_time,
        const int time_step)
{
    std::list<struct PassDetails> pass_list;

    libsgp4::Observer obs(user_geo);

    libsgp4::DateTime aos_time;
    libsgp4::DateTime los_time;

    bool found_aos = false;

    libsgp4::DateTime previous_time(start_time);
    libsgp4::DateTime current_time(start_time);

    while (current_time < end_time)
    {
        bool end_of_pass = false;

        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(current_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

        if (!found_aos && topo.elevation > 0.0)
        {
            /*
             * aos hasnt occured yet, but the satellite is now above horizon
             * this must have occured within the last time_step
             */
            if (start_time == current_time)
            {
                /*
                 * satellite was already above the horizon at the start,
                 * so use the start time
                 */
                aos_time = start_time;
            }
            else
            {
                /*
                 * find the point at which the satellite crossed the horizon
                 */
                aos_time = FindCrossingPoint(
                        user_geo,
                        sgp4,
                        previous_time,
                        current_time,
                        true);
            }
            found_aos = true;
        }
        else if (found_aos && topo.elevation < 0.0)
        {
            found_aos = false;
            /*
             * end of pass, so move along more than time_step
             */
            end_of_pass = true;
            /*
             * already have the aos, but now the satellite is below the horizon,
             * so find the los
             */
            los_time = FindCrossingPoint(
                    user_geo,
                    sgp4,
                    previous_time,
                    current_time,
                    false);

            struct PassDetails pd;
            pd.aos = aos_time;
            pd.los = los_time;
            pd.max_elevation = FindMaxElevation(
                    user_geo,
                    sgp4,
                    aos_time,
                    los_time);

            pass_list.push_back(pd);
        }

        /*
         * save current time
         */
        previous_time = current_time;

        if (end_of_pass)
        {
            /*
             * at the end of the pass move the time along by 30mins
             */
            current_time = current_time + libsgp4::TimeSpan(0, 30, 0);
        }
        else
        {
            /*
             * move the time along by the time step value
             */
            current_time = current_time + libsgp4::TimeSpan(0, 0, time_step);
        }

        if (current_time > end_time)
        {
            /*
             * dont go past end time
             */
            current_time = end_time;
        }
    };

    if (found_aos)
    {
        /*
         * satellite still above horizon at end of search period, so use end
         * time as los
         */
        struct PassDetails pd;
        pd.aos = aos_time;
        pd.los = end_time;
        pd.max_elevation = FindMaxElevation(user_geo, sgp4, aos_time, end_time);
        pass_list.push_back(pd);
    }

    return pass_list;
}